

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O1

void UnserializeTransaction<ParamsStream<BufferedFile&,TransactionSerParams>,CMutableTransaction>
               (CMutableTransaction *tx,ParamsStream<BufferedFile_&,_TransactionSerParams> *s,
               TransactionSerParams *params)

{
  vector<CTxOut,_std::allocator<CTxOut>_> *this;
  _Vector_impl_data *p_Var1;
  bool bVar2;
  pointer pvVar3;
  ulong uVar4;
  char *pcVar5;
  size_t in_RCX;
  pointer pCVar6;
  pointer pCVar7;
  pointer *ppvVar8;
  VectorFormatter<DefaultFormatter> VVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  uint32_t obj;
  uint32_t local_48 [2];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = params->allow_witness;
  BufferedFile::read(s->m_substream,(int)local_48,(void *)0x4,in_RCX);
  tx->version = local_48[0];
  std::vector<CTxIn,_std::allocator<CTxIn>_>::_M_erase_at_end
            (&tx->vin,(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start);
  this = &tx->vout;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::_M_erase_at_end
            (this,(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start);
  VectorFormatter<DefaultFormatter>::
  Unser<ParamsStream<BufferedFile&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
            ((VectorFormatter<DefaultFormatter> *)local_48,s,&tx->vin);
  if (((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_finish ==
       (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start & bVar2) == 1) {
    BufferedFile::read(s->m_substream,(int)local_48,(void *)0x1,in_RCX);
    VVar9 = local_48[0]._0_1_;
    if (local_48[0]._0_1_ != (VectorFormatter<DefaultFormatter>)0x0) {
      VectorFormatter<DefaultFormatter>::
      Unser<ParamsStream<BufferedFile&,TransactionSerParams>,std::vector<CTxIn,std::allocator<CTxIn>>>
                ((VectorFormatter<DefaultFormatter> *)local_48,s,&tx->vin);
      VectorFormatter<DefaultFormatter>::
      Unser<ParamsStream<BufferedFile&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
                ((VectorFormatter<DefaultFormatter> *)local_48,s,this);
    }
  }
  else {
    VectorFormatter<DefaultFormatter>::
    Unser<ParamsStream<BufferedFile&,TransactionSerParams>,std::vector<CTxOut,std::allocator<CTxOut>>>
              ((VectorFormatter<DefaultFormatter> *)local_48,s,this);
    VVar9 = (VectorFormatter<DefaultFormatter>)0x0;
  }
  if ((bVar2 & (byte)VVar9 & 1) != 0) {
    pCVar7 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar6 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar6 == pCVar7) {
      uVar4 = 0;
    }
    else {
      lVar12 = 0x50;
      uVar10 = 0;
      do {
        VectorFormatter<DefaultFormatter>::
        Unser<ParamsStream<BufferedFile&,TransactionSerParams>,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                  ((VectorFormatter<DefaultFormatter> *)local_48,s,
                   (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)((pCVar7->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                      lVar12));
        uVar10 = uVar10 + 1;
        pCVar7 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pCVar6 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar4 = ((long)pCVar6 - (long)pCVar7 >> 3) * 0x4ec4ec4ec4ec4ec5;
        lVar12 = lVar12 + 0x68;
      } while (uVar10 < uVar4);
    }
    VVar9 = (VectorFormatter<DefaultFormatter>)((byte)VVar9 & 0xfe);
    in_RCX = CONCAT71((int7)((ulong)pCVar6 >> 8),pCVar6 != pCVar7);
    if (pCVar6 != pCVar7) {
      in_RCX = uVar4 + (uVar4 == 0);
      if ((pCVar7->scriptWitness).stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pCVar7->scriptWitness).stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00b37552;
      ppvVar8 = &pCVar7[1].scriptWitness.stack.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      uVar10 = 1;
      do {
        uVar11 = uVar10;
        if (in_RCX == uVar11) break;
        p_Var1 = (_Vector_impl_data *)(ppvVar8 + -1);
        pvVar3 = *ppvVar8;
        ppvVar8 = ppvVar8 + 0xd;
        uVar10 = uVar11 + 1;
      } while (p_Var1->_M_start == pvVar3);
      in_RCX = CONCAT71((int7)(in_RCX >> 8),uVar11 < uVar4);
    }
    if ((char)in_RCX == '\0') {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      local_40 = std::iostream_category();
      local_48[0] = 1;
      std::ios_base::failure[abi:cxx11]::failure(pcVar5,(error_code *)"Superfluous witness record");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_00b37684;
    }
  }
LAB_00b37552:
  if (VVar9 == (VectorFormatter<DefaultFormatter>)0x0) {
    BufferedFile::read(s->m_substream,(int)local_48,(void *)0x4,in_RCX);
    tx->nLockTime = local_48[0];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    local_40 = std::iostream_category();
    local_48[0] = 1;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar5,(error_code *)"Unknown transaction optional data");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_00b37684:
  __stack_chk_fail();
}

Assistant:

void UnserializeTransaction(TxType& tx, Stream& s, const TransactionSerParams& params)
{
    const bool fAllowWitness = params.allow_witness;

    s >> tx.version;
    unsigned char flags = 0;
    tx.vin.clear();
    tx.vout.clear();
    /* Try to read the vin. In case the dummy is there, this will be read as an empty vector. */
    s >> tx.vin;
    if (tx.vin.size() == 0 && fAllowWitness) {
        /* We read a dummy or an empty vin. */
        s >> flags;
        if (flags != 0) {
            s >> tx.vin;
            s >> tx.vout;
        }
    } else {
        /* We read a non-empty vin. Assume a normal vout follows. */
        s >> tx.vout;
    }
    if ((flags & 1) && fAllowWitness) {
        /* The witness flag is present, and we support witnesses. */
        flags ^= 1;
        for (size_t i = 0; i < tx.vin.size(); i++) {
            s >> tx.vin[i].scriptWitness.stack;
        }
        if (!tx.HasWitness()) {
            /* It's illegal to encode witnesses when all witness stacks are empty. */
            throw std::ios_base::failure("Superfluous witness record");
        }
    }
    if (flags) {
        /* Unknown flag in the serialization */
        throw std::ios_base::failure("Unknown transaction optional data");
    }
    s >> tx.nLockTime;
}